

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O0

void ncnn::resize_bilinear_c3
               (uchar *src,int srcw,int srch,int srcstride,uchar *dst,int w,int h,int stride)

{
  short sVar1;
  short sVar2;
  undefined1 auVar3 [16];
  short *psVar4;
  short *psVar5;
  ulong uVar6;
  int *piVar7;
  byte *pbVar8;
  byte *pbVar9;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R9D;
  double dVar10;
  int in_stack_00000008;
  uchar *Dp;
  uchar *Dp1;
  uchar *Dp0;
  uchar *S1p_1;
  uchar *S0p;
  short a1_2;
  short a0_2;
  int dx_2;
  short *rows1p_1;
  short *rows0p;
  short *ialphap_1;
  uchar *S1_1;
  uchar *S0;
  uchar *S1p;
  short a1_1;
  short a0_1;
  int dx_1;
  short *rows1p;
  short *ialphap;
  uchar *S1;
  short *rows0_old;
  int dy_1;
  int prev_sy1;
  short *rows1;
  short *rows0;
  Mat rowsbuf1;
  Mat rowsbuf0;
  float b1;
  float b0;
  int dy;
  float a1;
  float a0;
  int dx;
  int sy;
  int sx;
  float fy;
  float fx;
  short *ibeta;
  short *ialpha;
  int *yofs;
  int *xofs;
  int *buf;
  double scale_y;
  double scale_x;
  int INTER_RESIZE_COEF_SCALE;
  int INTER_RESIZE_COEF_BITS;
  short in_stack_000003a0;
  short in_stack_000003a8;
  short in_stack_000003b0;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  size_t in_stack_fffffffffffffd00;
  undefined8 in_stack_fffffffffffffd08;
  short **ppsVar11;
  Mat *in_stack_fffffffffffffd10;
  int local_29c;
  short *local_298;
  short *in_stack_fffffffffffffd70;
  short *in_stack_fffffffffffffd78;
  long in_stack_fffffffffffffd80;
  short *in_stack_fffffffffffffd88;
  byte *in_stack_fffffffffffffd90;
  int local_264;
  short *local_260;
  short *local_258;
  int local_240;
  int iVar12;
  int iVar13;
  short *Dp0_00;
  int in_stack_fffffffffffffddc;
  short *in_stack_fffffffffffffde0;
  short *rows0p_00;
  short *local_1d0;
  int *local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8;
  long *local_1b0;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 local_198;
  undefined8 local_190;
  int local_188 [3];
  int local_17c [3];
  float local_170;
  float local_16c;
  int local_168;
  int local_164 [3];
  int local_158 [3];
  float local_14c;
  float local_148;
  int local_144;
  int local_140;
  int local_13c;
  float local_138;
  float local_134;
  long local_130;
  short *local_128;
  void *local_120;
  void *local_118;
  void *local_110;
  double local_108;
  double local_100;
  undefined4 local_f4;
  undefined4 local_f0;
  int local_ec;
  int local_dc;
  int local_d8;
  int local_d4;
  long local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  int local_b4;
  short **local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  int local_94;
  undefined1 *local_90;
  undefined1 *local_88;
  short **local_78;
  int local_58;
  undefined4 local_54;
  short **local_50;
  undefined1 *local_30;
  
  local_f0 = 0xb;
  local_f4 = 0x800;
  local_100 = (double)in_ESI / (double)in_R9D;
  local_108 = (double)in_EDX / (double)in_stack_00000008;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(in_R9D * 2 + in_stack_00000008 * 2);
  uVar6 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_ec = in_R9D;
  local_dc = in_ECX;
  local_d8 = in_EDX;
  local_d4 = in_ESI;
  local_d0 = in_RDI;
  local_118 = operator_new__(uVar6);
  local_120 = (void *)((long)local_118 + (long)local_ec * 4);
  local_128 = (short *)((long)local_118 + (long)in_stack_00000008 * 4 + (long)local_ec * 4);
  local_130 = (long)local_118 +
              (long)local_ec * 4 + (long)in_stack_00000008 * 4 + (long)local_ec * 4;
  local_110 = local_118;
  for (local_144 = 0; local_144 < local_ec; local_144 = local_144 + 1) {
    local_134 = (float)(((double)local_144 + 0.5) * local_100 - 0.5);
    dVar10 = std::floor((double)(ulong)(uint)local_134);
    local_13c = (int)SUB84(dVar10,0);
    local_134 = local_134 - (float)local_13c;
    if (local_13c < 0) {
      local_13c = 0;
      local_134 = 0.0;
    }
    if (local_d4 + -1 <= local_13c) {
      local_13c = local_d4 + -2;
      local_134 = 1.0;
    }
    *(int *)((long)local_118 + (long)local_144 * 4) = local_13c * 3;
    local_148 = (1.0 - local_134) * 2048.0;
    local_14c = local_134 * 2048.0;
    local_158[2] = (int)(local_148 +
                        (float)(~-(uint)(0.0 <= local_148) & 0xbf000000 |
                               -(uint)(0.0 <= local_148) & 0x3f000000));
    local_158[1] = 0xffff8000;
    piVar7 = std::max<int>(local_158 + 2,local_158 + 1);
    local_158[0] = 0x7fff;
    piVar7 = std::min<int>(piVar7,local_158);
    local_128[local_144 << 1] = (short)*piVar7;
    local_164[2] = (int)(local_14c +
                        (float)(~-(uint)(0.0 <= local_14c) & 0xbf000000 |
                               -(uint)(0.0 <= local_14c) & 0x3f000000));
    local_164[1] = 0xffff8000;
    piVar7 = std::max<int>(local_164 + 2,local_164 + 1);
    local_164[0] = 0x7fff;
    piVar7 = std::min<int>(piVar7,local_164);
    local_128[local_144 * 2 + 1] = (short)*piVar7;
  }
  for (local_168 = 0; iVar12 = (int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
      local_168 < in_stack_00000008; local_168 = local_168 + 1) {
    local_138 = (float)(((double)local_168 + 0.5) * local_108 - 0.5);
    dVar10 = std::floor((double)(ulong)(uint)local_138);
    local_140 = (int)SUB84(dVar10,0);
    local_138 = local_138 - (float)local_140;
    if (local_140 < 0) {
      local_140 = 0;
      local_138 = 0.0;
    }
    if (local_d8 + -1 <= local_140) {
      local_140 = local_d8 + -2;
      local_138 = 1.0;
    }
    *(int *)((long)local_120 + (long)local_168 * 4) = local_140;
    local_16c = (1.0 - local_138) * 2048.0;
    local_170 = local_138 * 2048.0;
    local_17c[2] = (int)(local_16c +
                        (float)(~-(uint)(0.0 <= local_16c) & 0xbf000000 |
                               -(uint)(0.0 <= local_16c) & 0x3f000000));
    local_17c[1] = 0xffff8000;
    piVar7 = std::max<int>(local_17c + 2,local_17c + 1);
    local_17c[0] = 0x7fff;
    piVar7 = std::min<int>(piVar7,local_17c);
    *(short *)(local_130 + (long)(local_168 << 1) * 2) = (short)*piVar7;
    local_188[2] = (int)(local_170 +
                        (float)(~-(uint)(0.0 <= local_170) & 0xbf000000 |
                               -(uint)(0.0 <= local_170) & 0x3f000000));
    local_188[1] = 0xffff8000;
    piVar7 = std::max<int>(local_188 + 2,local_188 + 1);
    local_188[0] = 0x7fff;
    piVar7 = std::min<int>(piVar7,local_188);
    *(short *)(local_130 + (long)(local_168 * 2 + 1) * 2) = (short)*piVar7;
  }
  local_b4 = local_ec * 3 + 1;
  local_b0 = &local_1d0;
  local_c0 = 2;
  local_c8 = 0;
  local_1d0 = (short *)0x0;
  local_1c8 = (int *)0x0;
  local_1c0 = 0;
  local_1b8 = 0;
  local_1b0 = (long *)0x0;
  local_1a8 = 0;
  local_1a4 = 0;
  local_1a0 = 0;
  local_19c = 0;
  local_198 = 0;
  local_190 = 0;
  Mat::create(in_stack_fffffffffffffd10,iVar12,in_stack_fffffffffffffd00,
              (Allocator *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  local_94 = local_ec * 3 + 1;
  local_90 = &stack0xfffffffffffffde8;
  local_a0 = 2;
  local_a8 = 0;
  local_298 = (short *)0x0;
  Mat::create(in_stack_fffffffffffffd10,iVar12,in_stack_fffffffffffffd00,
              (Allocator *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  iVar12 = -2;
  Dp0_00 = local_1d0;
  rows0p_00 = local_298;
  for (local_240 = 0; local_240 < in_stack_00000008; local_240 = local_240 + 1) {
    iVar13 = *(int *)((long)local_120 + (long)local_240 * 4);
    psVar4 = local_298;
    psVar5 = Dp0_00;
    if (iVar13 != iVar12) {
      if (iVar13 == iVar12 + 1) {
        local_258 = local_128;
        local_260 = Dp0_00;
        for (local_264 = 0; psVar4 = Dp0_00, psVar5 = local_298, local_264 < local_ec;
            local_264 = local_264 + 1) {
          local_13c = *(int *)((long)local_118 + (long)local_264 * 4);
          sVar1 = *local_258;
          sVar2 = local_258[1];
          in_stack_fffffffffffffd90 = (byte *)(local_d0 + local_dc * (iVar13 + 1) + (long)local_13c)
          ;
          *local_260 = (short)((int)((uint)*in_stack_fffffffffffffd90 * (int)sVar1 +
                                    (uint)in_stack_fffffffffffffd90[3] * (int)sVar2) >> 4);
          local_260[1] = (short)((int)((uint)in_stack_fffffffffffffd90[1] * (int)sVar1 +
                                      (uint)in_stack_fffffffffffffd90[4] * (int)sVar2) >> 4);
          local_260[2] = (short)((int)((uint)in_stack_fffffffffffffd90[2] * (int)sVar1 +
                                      (uint)in_stack_fffffffffffffd90[5] * (int)sVar2) >> 4);
          local_258 = local_258 + 2;
          local_260 = local_260 + 3;
        }
      }
      else {
        in_stack_fffffffffffffd88 = (short *)(local_d0 + local_dc * iVar13);
        in_stack_fffffffffffffd80 = local_d0 + local_dc * (iVar13 + 1);
        in_stack_fffffffffffffd70 = Dp0_00;
        in_stack_fffffffffffffd78 = local_128;
        for (local_29c = 0; local_29c < local_ec; local_29c = local_29c + 1) {
          local_13c = *(int *)((long)local_118 + (long)local_29c * 4);
          sVar1 = *in_stack_fffffffffffffd78;
          sVar2 = in_stack_fffffffffffffd78[1];
          pbVar8 = (byte *)((long)in_stack_fffffffffffffd88 + (long)local_13c);
          pbVar9 = (byte *)(in_stack_fffffffffffffd80 + local_13c);
          *in_stack_fffffffffffffd70 =
               (short)((int)((uint)*pbVar8 * (int)sVar1 + (uint)pbVar8[3] * (int)sVar2) >> 4);
          in_stack_fffffffffffffd70[1] =
               (short)((int)((uint)pbVar8[1] * (int)sVar1 + (uint)pbVar8[4] * (int)sVar2) >> 4);
          in_stack_fffffffffffffd70[2] =
               (short)((int)((uint)pbVar8[2] * (int)sVar1 + (uint)pbVar8[5] * (int)sVar2) >> 4);
          *local_298 = (short)((int)((uint)*pbVar9 * (int)sVar1 + (uint)pbVar9[3] * (int)sVar2) >> 4
                              );
          local_298[1] = (short)((int)((uint)pbVar9[1] * (int)sVar1 + (uint)pbVar9[4] * (int)sVar2)
                                >> 4);
          local_298[2] = (short)((int)((uint)pbVar9[2] * (int)sVar1 + (uint)pbVar9[5] * (int)sVar2)
                                >> 4);
          in_stack_fffffffffffffd78 = in_stack_fffffffffffffd78 + 2;
          in_stack_fffffffffffffd70 = in_stack_fffffffffffffd70 + 3;
          local_298 = local_298 + 3;
        }
      }
    }
    Dp0_00 = psVar5;
    local_298 = psVar4;
    local_140 = iVar13;
    if ((local_240 + 1 < in_stack_00000008) &&
       (*(int *)((long)local_120 + (long)(local_240 + 1) * 4) == iVar13)) {
      vresize_two(rows0p_00,in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,(uchar *)Dp0_00,
                  (uchar *)local_298,(short)((uint)iVar13 >> 0x10),in_stack_000003a0,
                  in_stack_000003a8,in_stack_000003b0);
      local_130 = local_130 + 8;
      local_240 = local_240 + 1;
    }
    else {
      vresize_one((short *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                  (int)((ulong)in_stack_fffffffffffffd80 >> 0x20),(uchar *)in_stack_fffffffffffffd78
                  ,(short)((ulong)in_stack_fffffffffffffd70 >> 0x30),
                  (short)((ulong)in_stack_fffffffffffffd70 >> 0x20));
      local_130 = local_130 + 4;
    }
    iVar12 = iVar13;
  }
  if (local_110 != (void *)0x0) {
    operator_delete__(local_110);
  }
  local_88 = &stack0xfffffffffffffde8;
  ppsVar11 = &local_1d0;
  if (local_1c8 != (int *)0x0) {
    local_54 = 0xffffffff;
    LOCK();
    local_58 = *local_1c8;
    *local_1c8 = *local_1c8 + -1;
    UNLOCK();
    if (local_58 == 1) {
      local_78 = ppsVar11;
      local_50 = ppsVar11;
      local_30 = local_88;
      if (local_1b0 == (long *)0x0) {
        if (local_1d0 != (short *)0x0) {
          free(local_1d0);
        }
      }
      else {
        (**(code **)(*local_1b0 + 0x18))(local_1b0,local_1d0);
      }
    }
  }
  *ppsVar11 = (short *)0x0;
  ppsVar11[2] = (short *)0x0;
  *(undefined4 *)(ppsVar11 + 3) = 0;
  *(undefined4 *)(ppsVar11 + 5) = 0;
  *(undefined4 *)((long)ppsVar11 + 0x2c) = 0;
  *(undefined4 *)(ppsVar11 + 6) = 0;
  *(undefined4 *)((long)ppsVar11 + 0x34) = 0;
  *(undefined4 *)(ppsVar11 + 7) = 0;
  ppsVar11[8] = (short *)0x0;
  ppsVar11[1] = (short *)0x0;
  return;
}

Assistant:

void resize_bilinear_c3(const unsigned char* src, int srcw, int srch, int srcstride, unsigned char* dst, int w, int h, int stride)
{
    const int INTER_RESIZE_COEF_BITS = 11;
    const int INTER_RESIZE_COEF_SCALE = 1 << INTER_RESIZE_COEF_BITS;

    double scale_x = (double)srcw / w;
    double scale_y = (double)srch / h;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;     //new int[w];
    int* yofs = buf + w; //new int[h];

    short* ialpha = (short*)(buf + w + h);    //new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w); //new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = static_cast<int>(floor(fx));
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= srcw - 1)
        {
            sx = srcw - 2;
            fx = 1.f;
        }

        xofs[dx] = sx * 3;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 = fx * INTER_RESIZE_COEF_SCALE;

        ialpha[dx * 2] = SATURATE_CAST_SHORT(a0);
        ialpha[dx * 2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = static_cast<int>(floor(fy));
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= srch - 1)
        {
            sy = srch - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 = fy * INTER_RESIZE_COEF_SCALE;

        ibeta[dy * 2] = SATURATE_CAST_SHORT(b0);
        ibeta[dy * 2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w * 3 + 1, (size_t)2u);
    Mat rowsbuf1(w * 3 + 1, (size_t)2u);
    short* rows0 = (short*)rowsbuf0.data;
    short* rows1 = (short*)rowsbuf1.data;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S1 = uint8x8_t();

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p + 1, _S1, 1);
                _S1 = vld1_lane_u8(S1p + 2, _S1, 2);
                _S1 = vld1_lane_u8(S1p + 3, _S1, 3);
                _S1 = vld1_lane_u8(S1p + 4, _S1, 4);
                _S1 = vld1_lane_u8(S1p + 5, _S1, 5);

                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S1low = vget_low_s16(_S116);
                int16x4_t _S1high = vext_s16(_S1low, vget_high_s16(_S116), 3);
                int32x4_t _rows1 = vmull_s16(_S1low, _a0);
                _rows1 = vmlal_s16(_rows1, _S1high, _a1);
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows1p[0] = (S1p[0] * a0 + S1p[3] * a1) >> 4;
                rows1p[1] = (S1p[1] * a0 + S1p[4] * a1) >> 4;
                rows1p[2] = (S1p[2] * a0 + S1p[5] * a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows1p += 3;
            }
        }
        else
        {
            // hresize two rows
            const unsigned char* S0 = src + srcstride * (sy);
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows0p = rows0;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S0p = S0 + sx;
                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S0 = uint8x8_t();
                uint8x8_t _S1 = uint8x8_t();

                _S0 = vld1_lane_u8(S0p, _S0, 0);
                _S0 = vld1_lane_u8(S0p + 1, _S0, 1);
                _S0 = vld1_lane_u8(S0p + 2, _S0, 2);
                _S0 = vld1_lane_u8(S0p + 3, _S0, 3);
                _S0 = vld1_lane_u8(S0p + 4, _S0, 4);
                _S0 = vld1_lane_u8(S0p + 5, _S0, 5);

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p + 1, _S1, 1);
                _S1 = vld1_lane_u8(S1p + 2, _S1, 2);
                _S1 = vld1_lane_u8(S1p + 3, _S1, 3);
                _S1 = vld1_lane_u8(S1p + 4, _S1, 4);
                _S1 = vld1_lane_u8(S1p + 5, _S1, 5);

                int16x8_t _S016 = vreinterpretq_s16_u16(vmovl_u8(_S0));
                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S0low = vget_low_s16(_S016);
                int16x4_t _S1low = vget_low_s16(_S116);
                int16x4_t _S0high = vext_s16(_S0low, vget_high_s16(_S016), 3);
                int16x4_t _S1high = vext_s16(_S1low, vget_high_s16(_S116), 3);
                int32x4_t _rows0 = vmull_s16(_S0low, _a0);
                int32x4_t _rows1 = vmull_s16(_S1low, _a0);
                _rows0 = vmlal_s16(_rows0, _S0high, _a1);
                _rows1 = vmlal_s16(_rows1, _S1high, _a1);
                int16x4_t _rows0_sr4 = vshrn_n_s32(_rows0, 4);
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows0p, _rows0_sr4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows0p[0] = (S0p[0] * a0 + S0p[3] * a1) >> 4;
                rows0p[1] = (S0p[1] * a0 + S0p[4] * a1) >> 4;
                rows0p[2] = (S0p[2] * a0 + S0p[5] * a1) >> 4;
                rows1p[0] = (S1p[0] * a0 + S1p[3] * a1) >> 4;
                rows1p[1] = (S1p[1] * a0 + S1p[4] * a1) >> 4;
                rows1p[2] = (S1p[2] * a0 + S1p[5] * a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows0p += 3;
                rows1p += 3;
            }
        }

        prev_sy1 = sy;

        if (dy + 1 < h && yofs[dy + 1] == sy)
        {
            // vresize for two rows
            unsigned char* Dp0 = dst + stride * dy;
            unsigned char* Dp1 = dst + stride * (dy + 1);

            vresize_two(rows0, rows1, w * 3, Dp0, Dp1, ibeta[0], ibeta[1], ibeta[2], ibeta[3]);

            ibeta += 4;
            dy += 1;
        }
        else
        {
            // vresize
            unsigned char* Dp = dst + stride * dy;

            vresize_one(rows0, rows1, w * 3, Dp, ibeta[0], ibeta[1]);

            ibeta += 2;
        }
    }

    delete[] buf;
}